

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O3

void __thiscall
slang::ast::Expression::visit<(anonymous_namespace)::HierarchicalVisitor&>
          (Expression *this,HierarchicalVisitor *visitor)

{
  IndexSetter *setter;
  StreamExpression *stream;
  
  (*(code *)(&DAT_004bf764 + *(int *)(&DAT_004bf764 + (ulong)this->kind * 4)))();
  return;
}

Assistant:

decltype(auto) Expression::visit(TVisitor&& visitor, Args&&... args) const {
    return visitExpression(this, visitor, std::forward<Args>(args)...);
}